

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

void snga_select_elem(Integer type,char *op,void *ptr,Integer elems,elem_info_t *info,Integer *ind)

{
  float *pfVar1;
  long lVar2;
  int iVar3;
  long in_RCX;
  double *in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  double *in_R8;
  long *in_R9;
  float fVar4;
  double dVar5;
  float tmp_3;
  float tmp_2;
  DoublePrecision tmp_1;
  DoublePrecision tmp;
  Integer i;
  Integer in_stack_000000e8;
  char *in_stack_000000f0;
  double local_98;
  double local_88;
  float local_74;
  double *local_68;
  double *local_60;
  double local_58;
  float local_44;
  long local_38;
  
  switch(in_RDI) {
  case 0x3e9:
    local_44 = *(float *)in_RDX;
    iVar3 = strncmp(in_RSI,"min",3);
    if (iVar3 == 0) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        if ((int)*(float *)((long)in_RDX + local_38 * 4) < (int)local_44) {
          local_44 = *(float *)((long)in_RDX + local_38 * 4);
          *in_R9 = local_38;
        }
      }
    }
    else {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        if ((int)local_44 < (int)*(float *)((long)in_RDX + local_38 * 4)) {
          local_44 = *(float *)((long)in_RDX + local_38 * 4);
          *in_R9 = local_38;
        }
      }
    }
    *(float *)in_R8 = local_44;
    break;
  case 0x3ea:
    local_88 = *in_RDX;
    iVar3 = strncmp(in_RSI,"min",3);
    if (iVar3 == 0) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        if ((long)in_RDX[local_38] < (long)local_88) {
          local_88 = in_RDX[local_38];
          *in_R9 = local_38;
        }
      }
    }
    else {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        if ((long)local_88 < (long)in_RDX[local_38]) {
          local_88 = in_RDX[local_38];
          *in_R9 = local_38;
        }
      }
    }
    *in_R8 = local_88;
    break;
  case 0x3eb:
    local_74 = *(float *)in_RDX;
    iVar3 = strncmp(in_RSI,"min",3);
    if (iVar3 == 0) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        pfVar1 = (float *)((long)in_RDX + local_38 * 4);
        if (*pfVar1 <= local_74 && local_74 != *pfVar1) {
          local_74 = *(float *)((long)in_RDX + local_38 * 4);
          *in_R9 = local_38;
        }
      }
    }
    else {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        if (local_74 < *(float *)((long)in_RDX + local_38 * 4)) {
          local_74 = *(float *)((long)in_RDX + local_38 * 4);
          *in_R9 = local_38;
        }
      }
    }
    *(float *)in_R8 = local_74;
    break;
  case 0x3ec:
    local_58 = *in_RDX;
    iVar3 = strncmp(in_RSI,"min",3);
    if (iVar3 == 0) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        if (in_RDX[local_38] <= local_58 && local_58 != in_RDX[local_38]) {
          local_58 = in_RDX[local_38];
          *in_R9 = local_38;
        }
      }
    }
    else {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        if (local_58 < in_RDX[local_38]) {
          local_58 = in_RDX[local_38];
          *in_R9 = local_38;
        }
      }
    }
    *in_R8 = local_58;
    break;
  default:
    pnga_error(in_stack_000000f0,in_stack_000000e8);
    break;
  case 0x3ee:
    local_74 = *(float *)in_RDX * *(float *)in_RDX +
               *(float *)((long)in_RDX + 4) * *(float *)((long)in_RDX + 4);
    iVar3 = strncmp(in_RSI,"min",3);
    local_68 = in_RDX;
    if (iVar3 == 0) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        fVar4 = *(float *)local_68 * *(float *)local_68 +
                *(float *)((long)local_68 + 4) * *(float *)((long)local_68 + 4);
        if (fVar4 < local_74) {
          *in_R9 = local_38;
          local_74 = fVar4;
        }
        local_68 = local_68 + 1;
      }
    }
    else {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        fVar4 = *(float *)local_68 * *(float *)local_68 +
                *(float *)((long)local_68 + 4) * *(float *)((long)local_68 + 4);
        if (local_74 < fVar4) {
          *in_R9 = local_38;
          local_74 = fVar4;
        }
        local_68 = local_68 + 1;
      }
    }
    *(float *)in_R8 = local_74;
    in_R8[10] = in_RDX[*in_R9];
    break;
  case 0x3ef:
    local_58 = *in_RDX * *in_RDX + in_RDX[1] * in_RDX[1];
    iVar3 = strncmp(in_RSI,"min",3);
    local_60 = in_RDX;
    if (iVar3 == 0) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        dVar5 = *local_60 * *local_60 + local_60[1] * local_60[1];
        if (dVar5 < local_58) {
          *in_R9 = local_38;
          local_58 = dVar5;
        }
        local_60 = local_60 + 2;
      }
    }
    else {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        dVar5 = *local_60 * *local_60 + local_60[1] * local_60[1];
        if (local_58 < dVar5) {
          *in_R9 = local_38;
          local_58 = dVar5;
        }
        local_60 = local_60 + 2;
      }
    }
    *in_R8 = local_58;
    lVar2 = *in_R9;
    in_R8[8] = in_RDX[lVar2 * 2];
    in_R8[9] = (in_RDX + lVar2 * 2)[1];
    break;
  case 0x3f8:
    local_98 = *in_RDX;
    iVar3 = strncmp(in_RSI,"min",3);
    if (iVar3 == 0) {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        if ((long)in_RDX[local_38] < (long)local_98) {
          local_98 = in_RDX[local_38];
          *in_R9 = local_38;
        }
      }
    }
    else {
      for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
        if ((long)local_98 < (long)in_RDX[local_38]) {
          local_98 = in_RDX[local_38];
          *in_R9 = local_38;
        }
      }
    }
    *in_R8 = local_98;
  }
  return;
}

Assistant:

static void snga_select_elem(Integer type, char* op, void *ptr, Integer elems, elem_info_t *info,
                      Integer *ind)
{
  Integer i;
  switch (type){
    int *ia,ival;
    double *da,dval;
    DoubleComplex *ca;
    SingleComplex *cfa;
    float *fa,fval;
    long *la,lval;
    long long *lla,llval;

    case C_INT:
    ia = (int*)ptr;
    ival = *ia;
    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(ival > ia[i]) {ival=ia[i];*ind=i; } } 
    else
      for(i=0;i<elems;i++){ if(ival < ia[i]) {ival=ia[i];*ind=i; } }

    info->v.ival = (int) ival;
    break;

    case C_DCPL:
    ca = (DoubleComplex*)ptr;
    dval=ca->real*ca->real + ca->imag*ca->imag;
    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++, ca+=1 ){
        DoublePrecision tmp = ca->real*ca->real + ca->imag*ca->imag; 
        if(dval > tmp){dval = tmp; *ind = i;}
      }
    else
      for(i=0;i<elems;i++, ca+=1 ){
        DoublePrecision tmp = ca->real*ca->real + ca->imag*ca->imag; 
        if(dval < tmp){dval = tmp; *ind = i;}
      }

    info->v.dval = dval; /* use abs value  for comparison*/
    info->extra = ((DoubleComplex*)ptr)[*ind]; /* append the actual val */
    break;

    case C_SCPL:
       cfa = (SingleComplex*)ptr;
       fval=cfa->real*cfa->real + cfa->imag*cfa->imag;
       if (strncmp(op,"min",3) == 0)
          for(i=0;i<elems;i++, cfa+=1 ){
             float tmp = cfa->real*cfa->real + cfa->imag*cfa->imag;
             if(fval > tmp){fval = tmp; *ind = i;}
          }
       else
          for(i=0;i<elems;i++, cfa+=1 ){
             float tmp = cfa->real*cfa->real + cfa->imag*cfa->imag;
             if(fval < tmp){fval = tmp; *ind = i;}
          }

       info->v.fval = fval; /* use abs value  for comparison*/
       info->extra2 = ((SingleComplex*)ptr)[*ind]; /* append the actual val */
       break;
                                                               
    case C_DBL:
    da = (double*)ptr;
    dval = *da;
    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(dval > da[i]) {dval=da[i];*ind=i; } }
    else
      for(i=0;i<elems;i++){ if(dval < da[i]) {dval=da[i];*ind=i; } }

    info->v.dval = dval; 
    break;

    case C_FLOAT:
    fa = (float*)ptr;
    fval = *fa;

    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(fval > fa[i]) {fval=fa[i];*ind=i; } }
    else
      for(i=0;i<elems;i++){ if(fval < fa[i]) {fval=fa[i];*ind=i; } }

    info->v.fval = fval;
    break;
    case C_LONG:
    la = (long*)ptr;
    lval = *la;

    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(lval > la[i]) {lval=la[i];*ind=i; } }
    else
      for(i=0;i<elems;i++){ if(lval < la[i]) {lval=la[i];*ind=i; } }

    info->v.lval = lval;
    break;
    case C_LONGLONG:
    lla = (long long*)ptr;
    llval = *lla;

    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(llval > lla[i]) {llval=lla[i];*ind=i; } }
    else
      for(i=0;i<elems;i++){ if(llval < lla[i]) {llval=lla[i];*ind=i; } }

    info->v.llval = llval;
    break;

    default: pnga_error(" wrong data type ",type);
  }
}